

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

int __thiscall CPoint::IsPin(CPoint *this)

{
  CObject *pCVar1;
  CNet *this_00;
  int iVar2;
  int iVar3;
  CPin *pCVar4;
  int iIndex;
  
  pCVar1 = (this->super_CObject).m_pParent;
  if (pCVar1 == (CObject *)0x0) {
    __assert_fail("GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xf9,"int CPoint::IsPin()");
  }
  this_00 = (CNet *)pCVar1->m_pParent;
  if (this_00 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Point.cpp"
                  ,0xfb,"int CPoint::IsPin()");
  }
  iVar2 = 0;
  do {
    iIndex = iVar2;
    iVar3 = CNet::GetNumPin(this_00);
    if (iVar3 <= iIndex) break;
    pCVar4 = CNet::GetPin(this_00,iIndex);
    iVar2 = iIndex + 1;
  } while ((this->m_iX != (pCVar4->super_CPoint).m_iX) ||
          (this->m_iY != (pCVar4->super_CPoint).m_iY));
  return (uint)(iIndex < iVar3);
}

Assistant:

CWire* CPoint::GetParent()
{
	return	(CWire*)m_pParent;
}